

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_account.c
# Opt level: O2

IOTHUB_ACCOUNT_INFO_HANDLE
IoTHubAccount_Init_With_Config(IOTHUB_ACCOUNT_CONFIG *config,_Bool testingModules)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  UNIQUEID_RESULT UVar5;
  IOTHUB_REGISTRYMANAGER_RESULT IVar6;
  IOTHUB_ACCOUNT_INFO_HANDLE acctHandle;
  IOTHUB_PROVISIONED_DEVICE **ppIVar7;
  char *pcVar8;
  char *pcVar9;
  size_t sVar10;
  LOGGER_LOG p_Var11;
  char *pcVar12;
  IOTHUB_SERVICE_CLIENT_AUTH_HANDLE serviceClientHandle;
  IOTHUB_MESSAGING_HANDLE pIVar13;
  IOTHUB_REGISTRYMANAGER_HANDLE pIVar14;
  IOTHUB_PROVISIONED_DEVICE *pIVar15;
  size_t sVar16;
  long lVar17;
  LOGGER_LOG l;
  long lVar18;
  int endHost;
  int beginHost;
  char *local_118;
  int local_110;
  int endIothub;
  char *local_108;
  char *local_100;
  char *local_f8;
  size_t local_f0;
  IOTHUB_PROVISIONED_DEVICE **local_e8;
  int beginIothub;
  int endName;
  char *local_d0;
  char *local_c8;
  IOTHUB_REGISTRYMANAGER_AUTH_METHOD local_c0;
  int beginName;
  char *pcStack_b0;
  char *local_a8;
  char *pcStack_a0;
  char *local_98;
  char *local_88;
  char *local_78;
  char *pcStack_70;
  char *local_68;
  char *local_50;
  char *pcStack_48;
  char *local_40;
  
  if (config == (IOTHUB_ACCOUNT_CONFIG *)0x0) {
    p_Var11 = xlogging_get_log_function();
    if (p_Var11 == (LOGGER_LOG)0x0) {
      return (IOTHUB_ACCOUNT_INFO_HANDLE)0x0;
    }
    pcVar8 = "[IoTHubAccount] invalid configuration (NULL)";
    iVar4 = 0x28a;
LAB_00119eb8:
    (*p_Var11)(AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
               ,"IoTHubAccount_Init_With_Config",iVar4,1,pcVar8);
    return (IOTHUB_ACCOUNT_INFO_HANDLE)0x0;
  }
  acctHandle = (IOTHUB_ACCOUNT_INFO_HANDLE)calloc(1,0xc0);
  if (acctHandle == (IOTHUB_ACCOUNT_INFO_HANDLE)0x0) {
    p_Var11 = xlogging_get_log_function();
    if (p_Var11 == (LOGGER_LOG)0x0) {
      return (IOTHUB_ACCOUNT_INFO_HANDLE)0x0;
    }
    pcVar8 = "[IoTHubAccount] Failed allocating IOTHUB_ACCOUNT_INFO.";
    iVar4 = 0x293;
    goto LAB_00119eb8;
  }
  sVar1 = config->number_of_sas_devices;
  ppIVar7 = (IOTHUB_PROVISIONED_DEVICE **)calloc(1,sVar1 * 8);
  acctHandle->sasDevices = ppIVar7;
  if (ppIVar7 == (IOTHUB_PROVISIONED_DEVICE **)0x0) {
    p_Var11 = xlogging_get_log_function();
    if (p_Var11 == (LOGGER_LOG)0x0) goto LAB_0011a222;
    pcVar8 = "[IoTHubAccount] Failed allocating array for SAS devices";
    iVar4 = 0x29e;
  }
  else {
    acctHandle->number_of_sas_devices = sVar1;
    pcVar8 = getenv("IOTHUB_CONNECTION_STRING");
    acctHandle->connString = pcVar8;
    pcVar9 = getenv("IOTHUB_EVENTHUB_CONNECTION_STRING");
    acctHandle->eventhubConnString = pcVar9;
    getenv("IOTHUB_E2E_X509_CERT_BASE64");
    getenv("IOTHUB_E2E_X509_PRIVATE_KEY_BASE64");
    getenv("IOTHUB_E2E_X509_THUMBPRINT");
    if (pcVar8 == (char *)0x0) {
      p_Var11 = xlogging_get_log_function();
      if (p_Var11 == (LOGGER_LOG)0x0) goto LAB_0011a222;
      pcVar8 = "Failure retrieving IoT Hub connection string from the environment.\r\n";
      iVar4 = 0x2b7;
    }
    else if (pcVar9 == (char *)0x0) {
      p_Var11 = xlogging_get_log_function();
      if (p_Var11 == (LOGGER_LOG)0x0) goto LAB_0011a222;
      pcVar8 = "Failure retrieving Event Hub connection string from the environment.\r\n";
      iVar4 = 0x2bd;
    }
    else {
      sVar10 = strlen(pcVar8);
      iVar3 = __isoc99_sscanf(pcVar8,
                              "HostName=%n%*[^.]%n.%n%*[^;];%nSharedAccessKeyName=%n%*[^;];%nSharedAccessKey=%n"
                              ,&beginHost,&endHost,&beginIothub,&endIothub,&beginName,&endName,
                              &local_110);
      iVar4 = beginHost;
      if (iVar3 == 0) {
        lVar17 = (long)endHost;
        lVar18 = (long)beginHost;
        pcVar8 = (char *)malloc((long)((endHost - beginHost) + 1));
        acctHandle->iothubName = pcVar8;
        if (pcVar8 == (char *)0x0) {
          p_Var11 = xlogging_get_log_function();
          if (p_Var11 != (LOGGER_LOG)0x0) {
            pcVar8 = "Failure allocating iothubName.\r\n";
            iVar4 = 0x9f;
            goto LAB_00119e46;
          }
        }
        else {
          pcVar9 = (char *)malloc((long)((endIothub - iVar4) + 1));
          acctHandle->hostname = pcVar9;
          if (pcVar9 == (char *)0x0) {
            p_Var11 = xlogging_get_log_function();
            if (p_Var11 != (LOGGER_LOG)0x0) {
              (*p_Var11)(AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                         ,"retrieveConnStringInfo",0xa4,1,"Failure allocating hostname.\r\n");
            }
            pcVar8 = acctHandle->iothubName;
          }
          else {
            pcVar12 = (char *)malloc((long)((endName - beginName) + 1));
            acctHandle->keyName = pcVar12;
            if (pcVar12 == (char *)0x0) {
              p_Var11 = xlogging_get_log_function();
              if (p_Var11 != (LOGGER_LOG)0x0) {
                (*p_Var11)(AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                           ,"retrieveConnStringInfo",0xaa,1,"Failure allocating keyname.\r\n");
              }
              pcVar8 = acctHandle->iothubName;
            }
            else {
              local_118 = pcVar12;
              pcVar12 = (char *)malloc((sVar10 - (long)local_110) + 2);
              acctHandle->sharedAccessKey = pcVar12;
              if (pcVar12 != (char *)0x0) {
                iVar4 = __isoc99_sscanf(acctHandle->connString,
                                        "HostName=%[^.].%[^;];SharedAccessKeyName=%[^;];SharedAccessKey=%s"
                                        ,pcVar8,pcVar9 + (lVar17 - lVar18) + 1,local_118,pcVar12);
                if (iVar4 == 4) {
                  strcpy(acctHandle->hostname,acctHandle->iothubName);
                  acctHandle->hostname[(long)endHost - (long)beginHost] = '.';
                  iVar4 = mallocAndStrcpy_s(&acctHandle->iothubSuffix,
                                            acctHandle->hostname +
                                            ((long)endHost - (long)beginHost) + 1);
                  if (iVar4 == 0) {
                    serviceClientHandle =
                         IoTHubServiceClientAuth_CreateFromConnectionString(acctHandle->connString);
                    acctHandle->iothub_service_client_auth_handle = serviceClientHandle;
                    if (serviceClientHandle != (IOTHUB_SERVICE_CLIENT_AUTH_HANDLE)0x0) {
                      pIVar13 = IoTHubMessaging_LL_Create(serviceClientHandle);
                      acctHandle->iothub_messaging_handle = pIVar13;
                      if (pIVar13 == (IOTHUB_MESSAGING_HANDLE)0x0) {
                        p_Var11 = xlogging_get_log_function();
                        if (p_Var11 == (LOGGER_LOG)0x0) goto LAB_0011a83e;
                        pcVar8 = "IoTHubMessaging_LL_Create failed\r\n";
                        iVar4 = 0x2fe;
                      }
                      else {
                        pIVar14 = IoTHubRegistryManager_Create
                                            (acctHandle->iothub_service_client_auth_handle);
                        acctHandle->iothub_registrymanager_handle = pIVar14;
                        if (pIVar14 == (IOTHUB_REGISTRYMANAGER_HANDLE)0x0) {
                          p_Var11 = xlogging_get_log_function();
                          if (p_Var11 == (LOGGER_LOG)0x0) goto LAB_0011a83e;
                          pcVar8 = "IoTHubRegistryManager_Create failed\r\n";
                          iVar4 = 0x307;
                        }
                        else {
                          local_118 = (char *)acctHandle->number_of_sas_devices;
                          local_e8 = acctHandle->sasDevices;
                          pcVar8 = (char *)0x0;
                          while( true ) {
                            if (local_118 == pcVar8) {
                              return acctHandle;
                            }
                            pIVar15 = (IOTHUB_PROVISIONED_DEVICE *)calloc(1,0x38);
                            local_e8[(long)pcVar8] = pIVar15;
                            if (pIVar15 == (IOTHUB_PROVISIONED_DEVICE *)0x0) break;
                            UVar5 = UniqueId_Generate((char *)&beginName,0x25);
                            if (UVar5 != UNIQUEID_OK) {
                              p_Var11 = xlogging_get_log_function();
                              if (p_Var11 != (LOGGER_LOG)0x0) {
                                pcVar9 = "Unable to generate unique Id.\r\n";
                                iVar4 = 0x72;
LAB_0011a764:
                                (*p_Var11)(AZ_LOG_ERROR,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                                           ,"generateDeviceName",iVar4,1,pcVar9);
                              }
LAB_0011a7a4:
                              p_Var11 = xlogging_get_log_function();
                              if (p_Var11 != (LOGGER_LOG)0x0) {
                                (*p_Var11)(AZ_LOG_ERROR,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                                           ,"provisionDevice",0x140,1,
                                           "generateDeviceName failed\r\n");
                              }
LAB_0011a7d6:
                              p_Var11 = xlogging_get_log_function();
                              if (p_Var11 != (LOGGER_LOG)0x0) {
                                pcVar9 = "Failed provisioning device number %lu";
                                iVar4 = 0x1c5;
                                goto LAB_0011a807;
                              }
                              goto LAB_0011a80c;
                            }
                            pcVar9 = (char *)malloc(0x4b);
                            if (pcVar9 == (char *)0x0) {
                              p_Var11 = xlogging_get_log_function();
                              if (p_Var11 != (LOGGER_LOG)0x0) {
                                pcVar9 = "Failure allocating device ID.\r\n";
                                iVar4 = 0x7b;
                                goto LAB_0011a764;
                              }
                              goto LAB_0011a7a4;
                            }
                            iVar4 = sprintf_s(pcVar9,0x4b,"csdk_e2eDevice_sas_j_please_delete_%s",
                                              &beginName);
                            p_Var11 = xlogging_get_log_function();
                            if (iVar4 < 1) {
                              if (p_Var11 != (LOGGER_LOG)0x0) {
                                (*p_Var11)(AZ_LOG_ERROR,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                                           ,"generateDeviceName",0x82,1,
                                           "Failure constructing device ID.\r\n");
                              }
                              free(pcVar9);
                              goto LAB_0011a7a4;
                            }
                            if (p_Var11 != (LOGGER_LOG)0x0) {
                              (*p_Var11)(AZ_LOG_INFO,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                                         ,"generateDeviceName",0x88,1,"Created Device %s.",pcVar9);
                            }
                            local_88 = (char *)0x0;
                            _beginName = (char *)0x0;
                            pcStack_b0 = (char *)0x0;
                            local_a8 = (char *)0x0;
                            pcStack_a0 = (char *)0x0;
                            local_98 = (char *)0x0;
                            local_78 = (char *)0x0;
                            pcStack_70 = (char *)0x0;
                            local_68 = (char *)0x0;
                            local_50 = (char *)0x0;
                            pcStack_48 = (char *)0x0;
                            local_40 = (char *)0x0;
                            pIVar15->howToCreate = IOTHUB_ACCOUNT_AUTH_CONNSTRING;
                            local_d0 = "";
                            local_c8 = "";
                            local_c0 = IOTHUB_REGISTRYMANAGER_AUTH_SPK;
                            _endName = pcVar9;
                            IVar6 = IoTHubRegistryManager_CreateDevice
                                              (acctHandle->iothub_registrymanager_handle,
                                               (IOTHUB_REGISTRY_DEVICE_CREATE *)&endName,
                                               (IOTHUB_DEVICE *)&beginName);
                            if (IVar6 == IOTHUB_REGISTRYMANAGER_OK) {
                              pIVar15->deviceId = pcVar9;
                              iVar4 = mallocAndStrcpy_s(&pIVar15->primaryAuthentication,pcStack_b0);
                              if (iVar4 == 0) {
                                pcVar9 = pIVar15->primaryAuthentication;
                                pcVar12 = pIVar15->deviceId;
                                local_f8 = acctHandle->hostname;
                                local_f0 = strlen(local_f8);
                                local_100 = pcVar12;
                                sVar10 = strlen(pcVar12);
                                local_108 = pcVar9;
                                sVar16 = strlen(pcVar9);
                                sVar10 = sVar10 + local_f0 + sVar16 + 0x25;
                                pcVar9 = (char *)malloc(sVar10);
                                if (pcVar9 == (char *)0x0) {
                                  p_Var11 = xlogging_get_log_function();
                                  if (p_Var11 != (LOGGER_LOG)0x0) {
                                    pcVar9 = "createSASConnectionString";
                                    iVar4 = 0x100;
                                    pcVar12 = 
                                    "Failed to allocate space for the SAS based connection string\r\n"
                                    ;
                                    goto LAB_0011a515;
                                  }
                                  goto LAB_0011a414;
                                }
                                iVar4 = sprintf_s(pcVar9,sVar10,"%s%s%s%s%s%s","HostName=",local_f8,
                                                  ";DeviceId=",local_100,";SharedAccessKey=",
                                                  local_108);
                                if (iVar4 < 1) {
                                  p_Var11 = xlogging_get_log_function();
                                  if (p_Var11 != (LOGGER_LOG)0x0) {
                                    (*p_Var11)(AZ_LOG_ERROR,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                                               ,"createSASConnectionString",0x105,1,
                                               "Failed to form the connection string for SAS based connection string.\r\n"
                                              );
                                  }
                                  goto LAB_0011a40f;
                                }
                                pIVar15->connectionString = pcVar9;
                                bVar2 = true;
                              }
                              else {
                                p_Var11 = xlogging_get_log_function();
                                if (p_Var11 == (LOGGER_LOG)0x0) goto LAB_0011a414;
                                pcVar9 = "provisionDevice";
                                iVar4 = 0x174;
                                pcVar12 = "mallocAndStrcpy_s failed for primaryKey\r\n";
LAB_0011a515:
                                bVar2 = false;
                                (*p_Var11)(AZ_LOG_ERROR,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                                           ,pcVar9,iVar4,1,pcVar12);
                              }
                            }
                            else {
                              p_Var11 = xlogging_get_log_function();
                              if (p_Var11 != (LOGGER_LOG)0x0) {
                                (*p_Var11)(AZ_LOG_ERROR,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                                           ,"provisionDevice",0x169,1,
                                           "IoTHubRegistryManager_CreateDevice failed\r\n");
                              }
LAB_0011a40f:
                              free(pcVar9);
LAB_0011a414:
                              bVar2 = false;
                            }
                            free(_beginName);
                            free(pcStack_b0);
                            free(local_a8);
                            free(pcStack_a0);
                            free(local_98);
                            free(local_88);
                            free(local_78);
                            free(pcStack_70);
                            free(local_68);
                            free(local_50);
                            free(pcStack_48);
                            free(local_40);
                            if (!bVar2) goto LAB_0011a7d6;
                            pcVar8 = pcVar8 + 1;
                          }
                          p_Var11 = xlogging_get_log_function();
                          if (p_Var11 != (LOGGER_LOG)0x0) {
                            pcVar9 = 
                            "Failed creating IOTHUB_PROVISIONED_DEVICE instance for device number %lu"
                            ;
                            iVar4 = 0x1bb;
LAB_0011a807:
                            (*p_Var11)(AZ_LOG_ERROR,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                                       ,"provisionDevices",iVar4,1,pcVar9,pcVar8);
                          }
LAB_0011a80c:
                          p_Var11 = xlogging_get_log_function();
                          if (p_Var11 == (LOGGER_LOG)0x0) goto LAB_0011a83e;
                          pcVar8 = "Failed to create the SAS device(s)\r\n";
                          iVar4 = 0x30f;
                        }
                      }
                      (*p_Var11)(AZ_LOG_ERROR,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                                 ,"IoTHubAccount_Init_With_Config",iVar4,1,pcVar8);
LAB_0011a83e:
                      IoTHubAccount_deinit(acctHandle);
                      return (IOTHUB_ACCOUNT_INFO_HANDLE)0x0;
                    }
                    p_Var11 = xlogging_get_log_function();
                    if (p_Var11 == (LOGGER_LOG)0x0) goto LAB_0011a222;
                    pcVar8 = "IoTHubServiceClientAuth_CreateFromConnectionString failed\r\n";
                    iVar4 = 0x2f5;
                    goto LAB_0011a21d;
                  }
                  p_Var11 = xlogging_get_log_function();
                  if (p_Var11 != (LOGGER_LOG)0x0) {
                    pcVar8 = "[IoTHubAccount] Failure constructing the iothubSuffix.";
                    iVar4 = 0xc9;
                    goto LAB_0011a1c7;
                  }
                }
                else {
                  p_Var11 = xlogging_get_log_function();
                  if (p_Var11 != (LOGGER_LOG)0x0) {
                    pcVar8 = "Failure determining the string values.\r\n";
                    iVar4 = 0xbc;
LAB_0011a1c7:
                    (*p_Var11)(AZ_LOG_ERROR,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                               ,"retrieveConnStringInfo",iVar4,1,pcVar8);
                  }
                }
                free(acctHandle->iothubName);
                free(acctHandle->hostname);
                free(acctHandle->keyName);
                pcVar8 = acctHandle->sharedAccessKey;
                goto LAB_0011a1eb;
              }
              p_Var11 = xlogging_get_log_function();
              if (p_Var11 != (LOGGER_LOG)0x0) {
                (*p_Var11)(AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                           ,"retrieveConnStringInfo",0xb1,1,
                           "Failure allocating shared access key.\r\n");
              }
              free(acctHandle->iothubName);
              pcVar8 = acctHandle->keyName;
            }
            free(pcVar8);
            pcVar8 = acctHandle->hostname;
          }
LAB_0011a1eb:
          free(pcVar8);
        }
      }
      else {
        p_Var11 = xlogging_get_log_function();
        if (p_Var11 != (LOGGER_LOG)0x0) {
          pcVar8 = "Failure determining the string length parameters.\r\n";
          iVar4 = 0x98;
LAB_00119e46:
          (*p_Var11)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                     ,"retrieveConnStringInfo",iVar4,1,pcVar8);
        }
      }
      p_Var11 = xlogging_get_log_function();
      if (p_Var11 == (LOGGER_LOG)0x0) goto LAB_0011a222;
      pcVar8 = "retrieveConnStringInfo failed.\r\n";
      iVar4 = 0x2ec;
    }
  }
LAB_0011a21d:
  (*p_Var11)(AZ_LOG_ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
             ,"IoTHubAccount_Init_With_Config",iVar4,1,pcVar8);
LAB_0011a222:
  free(acctHandle);
  return (IOTHUB_ACCOUNT_INFO_HANDLE)0x0;
}

Assistant:

IOTHUB_ACCOUNT_INFO_HANDLE IoTHubAccount_Init_With_Config(IOTHUB_ACCOUNT_CONFIG* config, bool testingModules)
{
    (void)testingModules;
    IOTHUB_ACCOUNT_INFO* iothub_account_info;

    if (config == NULL)
    {
        LogError("[IoTHubAccount] invalid configuration (NULL)");
        iothub_account_info = NULL;
    }
    else
    {
        iothub_account_info = malloc(sizeof(IOTHUB_ACCOUNT_INFO));

        if (iothub_account_info == NULL)
        {
            LogError("[IoTHubAccount] Failed allocating IOTHUB_ACCOUNT_INFO.");
        }
        else
        {
            char* base64_cert;
            char* base64_key;
            char* tempThumb;
            memset(iothub_account_info, 0, sizeof(IOTHUB_ACCOUNT_INFO));

            if ((iothub_account_info->sasDevices = (IOTHUB_PROVISIONED_DEVICE**)malloc(sizeof(IOTHUB_PROVISIONED_DEVICE*) * config->number_of_sas_devices)) == NULL)
            {
                LogError("[IoTHubAccount] Failed allocating array for SAS devices");
                free(iothub_account_info);
                iothub_account_info = NULL;
            }
            else
            {
                iothub_account_info->number_of_sas_devices = config->number_of_sas_devices;
                memset(iothub_account_info->sasDevices, 0, sizeof(IOTHUB_PROVISIONED_DEVICE*) * iothub_account_info->number_of_sas_devices);

#ifdef MBED_BUILD_TIMESTAMP
                iothub_account_info->connString = getMbedParameter("IOTHUB_CONNECTION_STRING");
                iothub_account_info->eventhubConnString = getMbedParameter("IOTHUB_EVENTHUB_CONNECTION_STRING");
                tempCert = getMbedParameter("IOTHUB_E2E_X509_CERT");
                tempKey = getMbedParameter("IOTHUB_E2E_X509_PRIVATE_KEY");
                tempThump = getMbedParameter("IOTHUB_E2E_X509_THUMBPRINT");
#else
                iothub_account_info->connString = getenv("IOTHUB_CONNECTION_STRING");
                iothub_account_info->eventhubConnString = getenv("IOTHUB_EVENTHUB_CONNECTION_STRING");
                base64_cert = getenv("IOTHUB_E2E_X509_CERT_BASE64");
                base64_key = getenv("IOTHUB_E2E_X509_PRIVATE_KEY_BASE64");
                tempThumb = getenv("IOTHUB_E2E_X509_THUMBPRINT");
#endif

                if (iothub_account_info->connString == NULL)
                {
                    LogError("Failure retrieving IoT Hub connection string from the environment.\r\n");
                    free(iothub_account_info);
                    iothub_account_info = NULL;
                }
                else if (iothub_account_info->eventhubConnString == NULL)
                {
                    LogError("Failure retrieving Event Hub connection string from the environment.\r\n");
                    free(iothub_account_info);
                    iothub_account_info = NULL;
                }
                /*else if (base64_cert == NULL)
                {
                    LogError("Failure retrieving x509 certificate from the environment.\r\n");
                    free(iothub_account_info);
                    iothub_account_info = NULL;
                }
                else if (base64_key == NULL)
                {
                    LogError("Failure retrieving x509 private key from the environment.\r\n");
                    free(iothub_account_info);
                    iothub_account_info = NULL;
                }
                else if (tempThumb == NULL)
                {
                    LogError("Failure retrieving x509 certificate thumbprint from the environment.\r\n");
                    free(iothub_account_info);
                    iothub_account_info = NULL;
                }
                else if ((iothub_account_info->x509Certificate = convert_base64_to_string(base64_cert)) == NULL)
                {
                    LogError("Failure allocating x509 certificate from the environment.\r\n");
                    free(iothub_account_info);
                    iothub_account_info = NULL;
                }
                else if ((iothub_account_info->x509PrivateKey = convert_base64_to_string(base64_key)) == NULL)
                {
                    LogError("Failure allocating x509 key from the environment.\r\n");
                    free(iothub_account_info->x509Certificate);
                    free(iothub_account_info);
                    iothub_account_info = NULL;
                }
                else if (mallocAndStrcpy_s(&iothub_account_info->x509Thumbprint, tempThumb) != 0)
                {
                    LogError("Failure allocating x509 thumb print from the environment.\r\n");
                    free(iothub_account_info->x509Certificate);
                    free(iothub_account_info->x509PrivateKey);
                    free(iothub_account_info);
                    iothub_account_info = NULL;
                }*/
                else
                {
                    if (retrieveConnStringInfo(iothub_account_info) != 0)
                    {
                        LogError("retrieveConnStringInfo failed.\r\n");
                        free(iothub_account_info);
                        iothub_account_info = NULL;
                    }
                    else
                    {
                        iothub_account_info->iothub_service_client_auth_handle = IoTHubServiceClientAuth_CreateFromConnectionString(iothub_account_info->connString);
                        if (iothub_account_info->iothub_service_client_auth_handle == NULL)
                        {
                            LogError("IoTHubServiceClientAuth_CreateFromConnectionString failed\r\n");
                            free(iothub_account_info);
                            iothub_account_info = NULL;
                        }
                        else
                        {
                            iothub_account_info->iothub_messaging_handle = IoTHubMessaging_LL_Create(iothub_account_info->iothub_service_client_auth_handle);
                            if (iothub_account_info->iothub_messaging_handle == NULL)
                            {
                                LogError("IoTHubMessaging_LL_Create failed\r\n");
                                IoTHubAccount_deinit(iothub_account_info);
                                iothub_account_info = NULL;
                            }
                            else
                            {
                                iothub_account_info->iothub_registrymanager_handle = IoTHubRegistryManager_Create(iothub_account_info->iothub_service_client_auth_handle);
                                if (iothub_account_info->iothub_registrymanager_handle == NULL)
                                {
                                    LogError("IoTHubRegistryManager_Create failed\r\n");
                                    IoTHubAccount_deinit(iothub_account_info);
                                    iothub_account_info = NULL;
                                }
                                else
                                {
                                    if (provisionDevices(iothub_account_info, IOTHUB_ACCOUNT_AUTH_CONNSTRING, iothub_account_info->sasDevices, iothub_account_info->number_of_sas_devices) != 0)
                                    {
                                        LogError("Failed to create the SAS device(s)\r\n");
                                        IoTHubAccount_deinit(iothub_account_info);
                                        iothub_account_info = NULL;
                                    }
                                    //else if (provisionDevice(iothub_account_info, IOTHUB_ACCOUNT_AUTH_X509, &iothub_account_info->x509Device) != 0)
                                    //{
                                    //    LogError("Failed to create the X509 device\r\n");
                                    //    IoTHubAccount_deinit(iothub_account_info);
                                    //    iothub_account_info = NULL;
                                    //}
                                    //else if (testingModules && provisionModule(iothub_account_info, iothub_account_info->sasDevices[0]))
                                    //{
                                    //    LogError("Failed to create the module\r\n");
                                    //    IoTHubAccount_deinit(iothub_account_info);
                                    //    iothub_account_info = NULL;
                                    //}
                                }
                            }
                        }
                    }
                }
            }
        }
    }

    return (IOTHUB_ACCOUNT_INFO_HANDLE)iothub_account_info;
}